

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinLaplace_picard_bnd.c
# Opt level: O2

int main(void)

{
  int iVar1;
  void *retvalvalue;
  void *retvalvalue_00;
  void *retvalvalue_01;
  void *retvalvalue_02;
  void *retvalvalue_03;
  long lVar2;
  double dVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  undefined8 *puVar7;
  int retval;
  SUNContext sunctx;
  double local_98;
  undefined8 *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  sunrealtype fnorm;
  long leniwB;
  long nfeD;
  long nje;
  long nni;
  undefined4 local_44;
  long lenrwB;
  long nfe;
  
  puts("\n2D elliptic PDE on unit square");
  puts("   d^2 u / dx^2 + d^2 u / dy^2 = u^3 - u + 2.0");
  puts(" + homogeneous Dirichlet boundary conditions\n");
  puts("Solution method: Anderson accelerated Picard iteration with band linear solver.");
  printf("Problem size: %2ld x %2ld = %4ld\n",0x1f,0x1f,0x3c1);
  retval = SUNContext_Create(0,&sunctx);
  iVar4 = 1;
  iVar1 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar1 == 0) {
    retvalvalue = (void *)N_VNew_Serial(0x3c1,sunctx);
    iVar1 = check_retval(retvalvalue,"N_VNew_Serial",0);
    if (iVar1 == 0) {
      retvalvalue_00 = (void *)N_VNew_Serial(0x3c1,sunctx);
      iVar1 = check_retval(retvalvalue_00,"N_VNew_Serial",0);
      if (iVar1 == 0) {
        retvalvalue_01 = (void *)KINCreate(sunctx);
        local_78 = retvalvalue_01;
        iVar1 = check_retval(retvalvalue_01,"KINCreate",0);
        if (iVar1 == 0) {
          retval = KINSetMAA(retvalvalue_01,3);
          iVar4 = 1;
          iVar1 = check_retval(&retval,"KINSetMAA",1);
          if (iVar1 == 0) {
            retval = KINInit(retvalvalue_01,func,retvalvalue);
            iVar4 = 1;
            iVar1 = check_retval(&retval,"KINInit",1);
            if (iVar1 == 0) {
              retval = KINSetFuncNormTol(0x3d719799812dea11,retvalvalue_01);
              iVar4 = 1;
              iVar1 = check_retval(&retval,"KINSetFuncNormTol",1);
              if (iVar1 == 0) {
                retvalvalue_02 = (void *)SUNBandMatrix(0x3c1,0x1f,0x1f,sunctx);
                iVar1 = check_retval(retvalvalue_02,"SUNBandMatrix",0);
                if (iVar1 == 0) {
                  retvalvalue_03 = (void *)SUNLinSol_Band(retvalvalue,retvalvalue_02,sunctx);
                  iVar1 = check_retval(retvalvalue_03,"SUNLinSol_Band",0);
                  if (iVar1 == 0) {
                    retval = KINSetLinearSolver(retvalvalue_01,retvalvalue_03,retvalvalue_02);
                    iVar4 = 1;
                    iVar1 = check_retval(&retval,"KINSetLinearSolver",1);
                    if (iVar1 == 0) {
                      retval = KINSetJacFn(retvalvalue_01,jac);
                      iVar4 = 1;
                      iVar1 = check_retval(&retval,"KINSetJacFn",1);
                      if (iVar1 == 0) {
                        N_VConst(0,retvalvalue);
                        lVar2 = N_VGetArrayPointer(retvalvalue);
                        *(undefined8 *)(lVar2 + 0x100) = 0x3ff0000000000000;
                        local_98 = 1.0;
                        N_VConst(retvalvalue_00);
                        retval = KINSol(retvalvalue_01,retvalvalue,2,retvalvalue_00,retvalvalue_00);
                        iVar4 = 1;
                        iVar1 = check_retval(&retval,"KINSol",1);
                        if (iVar1 == 0) {
                          retval = KINGetFuncNorm(retvalvalue_01,&fnorm);
                          iVar4 = 1;
                          iVar1 = check_retval(&retval,"KINGetfuncNorm",1);
                          if (iVar1 == 0) {
                            local_88 = retvalvalue_03;
                            local_80 = retvalvalue_02;
                            printf("\nComputed solution (||F|| = %g):\n\n",fnorm);
                            local_90 = (undefined8 *)N_VGetArrayPointer(retvalvalue);
                            printf("            ");
                            for (uVar6 = 1; uVar6 < 0x20; uVar6 = uVar6 + 3) {
                              printf("%-8.5f ",local_98 * 0.03125);
                              local_98 = local_98 + 3.0;
                            }
                            puts("\n");
                            dVar3 = 4.94065645841247e-324;
                            while ((ulong)dVar3 < 0x20) {
                              local_98 = dVar3;
                              printf("%-8.5f    ",(double)SUB84(dVar3,0) * 0.03125);
                              puVar7 = local_90;
                              for (uVar5 = 1; uVar5 < 0x20; uVar5 = uVar5 + 3) {
                                printf("%-8.5f ",*puVar7);
                                puVar7 = puVar7 + 0x5d;
                              }
                              putchar(10);
                              local_90 = local_90 + 3;
                              dVar3 = (double)((long)local_98 + 3);
                            }
                            local_44 = KINGetNumNonlinSolvIters(retvalvalue_01,&nni);
                            check_retval(&local_44,"KINGetNumNonlinSolvIters",1);
                            local_44 = KINGetNumFuncEvals(retvalvalue_01,&nfe);
                            check_retval(&local_44,"KINGetNumFuncEvals",1);
                            local_44 = KINGetNumJacEvals(retvalvalue_01,&nje);
                            check_retval(&local_44,"KINGetNumJacEvals",1);
                            local_44 = KINGetNumLinFuncEvals(retvalvalue_01,&nfeD);
                            check_retval(&local_44,"KINGetNumLinFuncEvals",1);
                            local_44 = KINGetLinWorkSpace(retvalvalue_01,&lenrwB,&leniwB);
                            check_retval(&local_44,"KINGetLinWorkSpace",1);
                            puts("\nFinal Statistics.. \n");
                            iVar4 = 0;
                            printf("nni      = %6ld    nfe     = %6ld \n",nni,nfe);
                            printf("nje      = %6ld    nfeB    = %6ld \n",nje,nfeD);
                            putchar(10);
                            printf("lenrwB   = %6ld    leniwB  = %6ld \n",lenrwB,leniwB);
                            N_VDestroy(retvalvalue);
                            N_VDestroy(retvalvalue_00);
                            KINFree(&local_78);
                            SUNLinSolFree(local_88);
                            SUNMatDestroy(local_80);
                            SUNContext_Free(&sunctx);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype fnormtol, fnorm;
  N_Vector y, scale;
  int retval;
  void* kmem;
  SUNMatrix J;
  SUNLinearSolver LS;

  y = scale = NULL;
  kmem      = NULL;
  J         = NULL;
  LS        = NULL;

  /* -------------------------
   * Print problem description
   * ------------------------- */

  printf("\n2D elliptic PDE on unit square\n");
  printf("   d^2 u / dx^2 + d^2 u / dy^2 = u^3 - u + 2.0\n");
  printf(" + homogeneous Dirichlet boundary conditions\n\n");
  printf("Solution method: Anderson accelerated Picard iteration with band "
         "linear solver.\n");
  printf("Problem size: %2ld x %2ld = %4ld\n", (long int)NX, (long int)NY,
         (long int)NEQ);

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* --------------------------------------
   * Create vectors for solution and scales
   * -------------------------------------- */

  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  scale = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)scale, "N_VNew_Serial", 0)) { return (1); }

  /* ----------------------------------------------------------------------------------
   * Initialize and allocate memory for KINSOL, set parametrs for Anderson acceleration
   * ---------------------------------------------------------------------------------- */

  kmem = KINCreate(sunctx);
  if (check_retval((void*)kmem, "KINCreate", 0)) { return (1); }

  /* y is used as a template */

  /* Use acceleration with up to 3 prior residuals */
  retval = KINSetMAA(kmem, 3);
  if (check_retval(&retval, "KINSetMAA", 1)) { return (1); }

  retval = KINInit(kmem, func, y);
  if (check_retval(&retval, "KINInit", 1)) { return (1); }

  /* -------------------
   * Set optional inputs
   * ------------------- */

  /* Specify stopping tolerance based on residual */

  fnormtol = FTOL;
  retval   = KINSetFuncNormTol(kmem, fnormtol);
  if (check_retval(&retval, "KINSetFuncNormTol", 1)) { return (1); }

  /* -------------------------
   * Create band SUNMatrix
   * ------------------------- */

  J = SUNBandMatrix(NEQ, NX, NX, sunctx);
  if (check_retval((void*)J, "SUNBandMatrix", 0)) { return (1); }

  /* ---------------------------
   * Create band SUNLinearSolver
   * --------------------------- */

  LS = SUNLinSol_Band(y, J, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Band", 0)) { return (1); }

  /* -------------------------
   * Attach band linear solver
   * ------------------------- */

  retval = KINSetLinearSolver(kmem, LS, J);
  if (check_retval(&retval, "KINSetLinearSolver", 1)) { return (1); }

  /* -------------------------
   * Set Jacobian function
   * ------------------------- */

  retval = KINSetJacFn(kmem, jac);
  if (check_retval(&retval, "KINSetJacFn", 1)) { return (1); }

  /* -------------
   * Initial guess
   * ------------- */

  N_VConst(ZERO, y);
  IJth(N_VGetArrayPointer(y), 2, 2) = ONE;

  /* ----------------------------
   * Call KINSol to solve problem
   * ---------------------------- */

  /* No scaling used */
  N_VConst(ONE, scale);

  /* Call main solver */
  retval = KINSol(kmem,       /* KINSol memory block */
                  y,          /* initial guess on input; solution vector */
                  KIN_PICARD, /* global strategy choice */
                  scale,      /* scaling vector, for the variable cc */
                  scale);     /* scaling vector for function values fval */
  if (check_retval(&retval, "KINSol", 1)) { return (1); }

  /* ------------------------------------
   * Print solution and solver statistics
   * ------------------------------------ */

  /* Get scaled norm of the system function */

  retval = KINGetFuncNorm(kmem, &fnorm);
  if (check_retval(&retval, "KINGetfuncNorm", 1)) { return (1); }

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("\nComputed solution (||F|| = %Lg):\n\n", fnorm);
#else
  printf("\nComputed solution (||F|| = %g):\n\n", fnorm);
#endif
  PrintOutput(y);

  PrintFinalStats(kmem);

  /* -----------
   * Free memory
   * ----------- */

  N_VDestroy(y);
  N_VDestroy(scale);
  KINFree(&kmem);
  SUNLinSolFree(LS);
  SUNMatDestroy(J);
  SUNContext_Free(&sunctx);

  return (0);
}